

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.c
# Opt level: O2

vrna_exp_param_t * get_exp_params_ali(vrna_md_t *md,uint n_seq,double pfs)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  vrna_exp_param_t *pvVar7;
  long lVar8;
  size_t sVar9;
  int (*paaiVar10) [5] [5];
  long lVar11;
  int (*paaiVar12) [5] [5];
  int (*paaiVar13) [5] [5];
  int iVar14;
  uint uVar15;
  double (*padVar16) [5];
  double (*padVar17) [8];
  int (*paaiVar18) [5] [5];
  double (*paaadVar19) [8] [5] [5];
  double (*paaadVar20) [8] [5] [5];
  double (*paaaadVar21) [8] [5] [5] [5];
  double (*paaaadVar22) [8] [5] [5] [5];
  long lVar23;
  int (*paaiVar24) [5] [5];
  int (*paaiVar25) [5] [5];
  int (*paaiVar26) [5] [5];
  int (*paaiVar27) [5] [5];
  int (*paaiVar28) [5] [5];
  int (*paaiVar29) [5] [5];
  int (*paiVar30) [5];
  int (*paaiVar31) [5] [5];
  double (*paaaaadVar32) [8] [5] [5] [5] [5];
  double (*paaaaadVar33) [8] [5] [5] [5] [5];
  int m;
  int iVar34;
  uint uVar35;
  int (*paiVar36) [5];
  long lVar37;
  long lVar38;
  long lVar39;
  int (*paiVar40) [8];
  vrna_exp_param_t *pvVar41;
  int (*paiVar42) [5];
  int (*paiVar43) [8];
  int (*paaiVar44) [5] [5];
  int (*paiVar45) [5];
  undefined4 uVar46;
  undefined4 uVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  int (*local_130) [5];
  int (*local_110) [5];
  int (*local_f0) [5];
  int (*local_e8) [5];
  int (*local_e0) [5];
  int (*local_d8) [5];
  int (*local_d0) [5];
  double (*local_c8) [8] [5] [5] [5] [5];
  double (*local_c0) [8] [5] [5] [5];
  double (*local_b8) [8] [5] [5];
  int (*local_b0) [5];
  int (*local_a8) [5];
  vrna_exp_param_t *local_a0;
  int (*local_98) [5];
  int (*local_90) [5];
  double (*local_88) [8] [5] [5] [5] [5];
  
  pvVar7 = (vrna_exp_param_t *)vrna_alloc(0x66760);
  memcpy(&pvVar7->model_details,md,0x7e8);
  uVar1 = md->temperature;
  uVar2 = md->betaScale;
  pvVar7->temperature = (double)uVar1;
  pvVar7->alpha = (double)uVar2;
  pvVar7->pf_scale = pfs;
  dVar4 = (double)uVar2 * (double)n_seq * ((double)uVar1 + 273.15) * 1.98717;
  pvVar7->kT = dVar4;
  iVar3 = md->pf_smooth;
  dVar50 = ((double)uVar1 + 273.15) / Tmeasure;
  pvVar7->lxc = lxc37 * dVar50;
  dVar48 = (double)DuplexInitdH - (double)(DuplexInitdH - DuplexInit37) * dVar50;
  if (iVar3 == 0) {
    dVar48 = (double)(int)dVar48;
  }
  dVar48 = exp((dVar48 * -10.0) / dVar4);
  pvVar7->expDuplexInit = dVar48;
  dVar48 = (double)TerminalAUdH - (double)(TerminalAUdH - TerminalAU37) * dVar50;
  if (iVar3 == 0) {
    dVar48 = (double)(int)dVar48;
  }
  dVar48 = exp((dVar48 * -10.0) / dVar4);
  pvVar7->expTermAU = dVar48;
  dVar48 = (double)ML_BASEdH - (double)(ML_BASEdH - ML_BASE37) * dVar50;
  if (iVar3 == 0) {
    dVar48 = (double)(int)dVar48;
  }
  dVar48 = exp(((dVar48 * -10.0) / dVar4) / (double)n_seq);
  pvVar7->expMLbase = dVar48;
  dVar48 = (double)ML_closingdH - (double)(ML_closingdH - ML_closing37) * dVar50;
  if (iVar3 == 0) {
    dVar48 = (double)(int)dVar48;
  }
  dVar48 = exp((dVar48 * -10.0) / dVar4);
  pvVar7->expMLclosing = dVar48;
  dVar48 = (double)GQuadLayerMismatchH -
           (double)(GQuadLayerMismatchH - GQuadLayerMismatch37) * dVar50;
  if (iVar3 == 0) {
    dVar48 = (double)(int)dVar48;
  }
  dVar48 = exp((dVar48 * -10.0) / dVar4);
  pvVar7->expgquadLayerMismatch = dVar48;
  pvVar7->gquadLayerMismatchMax = GQuadLayerMismatchMax;
  local_110 = (int (*) [5])(pvVar7->expgquad[2] + 3);
  for (lVar8 = 2; lVar8 != 8; lVar8 = lVar8 + 1) {
    lVar39 = 0;
    while (iVar5 = GQuadBetadH, iVar6 = GQuadAlphadH, lVar39 != 0x2b) {
      iVar34 = GQuadAlphadH - GQuadAlpha37;
      iVar14 = GQuadBetadH - GQuadBeta37;
      dVar48 = log((double)(int)(lVar39 + 1));
      dVar48 = ((double)iVar5 - (double)iVar14 * dVar50) * dVar48 +
               ((double)iVar6 - (double)iVar34 * dVar50) * (double)((int)lVar8 - 1);
      if (iVar3 == 0) {
        dVar48 = (double)(int)dVar48;
      }
      dVar48 = exp((dVar48 * -10.0) / dVar4);
      *(double *)((long)local_110 + lVar39 * 8) = dVar48;
      lVar39 = lVar39 + 1;
    }
    local_110 = (int (*) [5])((long)local_110 + 0x170);
  }
  for (lVar8 = 0; lVar8 != 0x1f; lVar8 = lVar8 + 1) {
    dVar48 = (double)hairpindH[lVar8] - (double)(hairpindH[lVar8] - hairpin37[lVar8]) * dVar50;
    if (iVar3 == 0) {
      dVar48 = (double)(int)dVar48;
    }
    dVar48 = exp((dVar48 * -10.0) / dVar4);
    pvVar7->exphairpin[lVar8] = dVar48;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    dVar48 = exp((dVar50 * -600.0 * 10.0) / dVar4);
    pvVar7->exphairpin[lVar8] = dVar48;
  }
  for (lVar8 = 0; lVar8 != 0x7c; lVar8 = lVar8 + 4) {
    dVar48 = (double)*(int *)((long)bulgedH + lVar8) -
             (double)(*(int *)((long)bulgedH + lVar8) - *(int *)((long)bulge37 + lVar8)) * dVar50;
    if (iVar3 == 0) {
      dVar48 = (double)(int)dVar48;
    }
    dVar48 = exp((dVar48 * -10.0) / dVar4);
    *(double *)((long)pvVar7->expbulge + lVar8 * 2) = dVar48;
    dVar48 = (double)*(int *)((long)internal_loopdH + lVar8) -
             (double)(*(int *)((long)internal_loopdH + lVar8) -
                     *(int *)((long)internal_loop37 + lVar8)) * dVar50;
    if (iVar3 == 0) {
      dVar48 = (double)(int)dVar48;
    }
    dVar48 = exp((dVar48 * -10.0) / dVar4);
    *(double *)((long)pvVar7->expinternal + lVar8 * 2) = dVar48;
  }
  if (james_rule != 0) {
    dVar48 = exp(-800.0 / dVar4);
    pvVar7->expinternal[2] = dVar48;
  }
  dVar48 = (double)niniodH;
  iVar6 = niniodH - ninio37;
  for (lVar8 = 0; lVar8 != 0x1f; lVar8 = lVar8 + 1) {
    dVar49 = (double)(int)lVar8 * (dVar48 - (double)iVar6 * dVar50);
    dVar51 = (double)MAX_NINIO;
    if (dVar49 <= (double)MAX_NINIO) {
      dVar51 = dVar49;
    }
    dVar51 = exp((dVar51 * -10.0) / dVar4);
    pvVar7->expninio[2][lVar8] = dVar51;
  }
  uVar15 = 0;
  uVar35 = 0;
  while( true ) {
    sVar9 = strlen(Tetraloops);
    if (sVar9 <= uVar15) break;
    dVar48 = (double)TetraloopdH[uVar35] -
             (double)(TetraloopdH[uVar35] - Tetraloop37[uVar35]) * dVar50;
    if (iVar3 == 0) {
      dVar48 = (double)(int)dVar48;
    }
    dVar48 = exp((dVar48 * -10.0) / dVar4);
    pvVar7->exptetra[uVar35] = dVar48;
    uVar35 = uVar35 + 1;
    uVar15 = uVar15 + 7;
  }
  uVar15 = 0;
  uVar35 = 0;
  while( true ) {
    sVar9 = strlen(Triloops);
    if (sVar9 <= uVar15) break;
    dVar48 = (double)TriloopdH[uVar35] - (double)(TriloopdH[uVar35] - Triloop37[uVar35]) * dVar50;
    if (iVar3 == 0) {
      dVar48 = (double)(int)dVar48;
    }
    dVar48 = exp((dVar48 * -10.0) / dVar4);
    pvVar7->exptri[uVar35] = dVar48;
    uVar35 = uVar35 + 1;
    uVar15 = uVar15 + 5;
  }
  uVar15 = 0;
  uVar35 = 0;
  while( true ) {
    sVar9 = strlen(Hexaloops);
    if (sVar9 <= uVar15) break;
    dVar48 = (double)HexaloopdH[uVar35] - (double)(HexaloopdH[uVar35] - Hexaloop37[uVar35]) * dVar50
    ;
    if (iVar3 == 0) {
      dVar48 = (double)(int)dVar48;
    }
    dVar48 = exp((dVar48 * -10.0) / dVar4);
    pvVar7->exphex[uVar35] = dVar48;
    uVar35 = uVar35 + 1;
    uVar15 = uVar15 + 9;
  }
  for (lVar8 = 0xc7fb; lVar8 != 0xc803; lVar8 = lVar8 + 1) {
    dVar48 = (double)ML_interndH - (double)(ML_interndH - ML_intern37) * dVar50;
    if (iVar3 == 0) {
      dVar48 = (double)(int)dVar48;
    }
    dVar48 = exp((dVar48 * -10.0) / dVar4);
    *(double *)((long)(pvVar7->expstack + -1) + 0x38 + lVar8 * 8) = dVar48;
  }
  padVar16 = pvVar7->expdangle5;
  local_130 = dangle3_dH;
  paiVar42 = dangle3_37;
  paiVar30 = dangle5_dH;
  paiVar36 = dangle5_37;
  for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
    for (lVar39 = 0; lVar39 != 0x14; lVar39 = lVar39 + 4) {
      if (md->dangles == 0) {
        *(undefined8 *)((long)*padVar16 + lVar39 * 2) = 0x3ff0000000000000;
        uVar46 = 0;
        uVar47 = 0x3ff00000;
      }
      else {
        iVar6 = *(int *)((long)*paiVar30 + lVar39);
        dVar48 = (double)iVar6 - (double)(iVar6 - *(int *)((long)*paiVar36 + lVar39)) * dVar50;
        if (iVar3 == 0) {
          dVar51 = 0.0;
          if ((int)dVar48 < 1) {
            dVar51 = -(double)(int)dVar48;
          }
        }
        else {
          dVar49 = dVar48 / -10.0;
          dVar51 = 0.0;
          if (-1.2283697 <= dVar49) {
            if (dVar49 <= 0.8660254) {
              dVar48 = sin(dVar49 + -0.34242663);
              iVar6 = *(int *)((long)*paiVar30 + lVar39);
              dVar51 = sin(((double)iVar6 -
                           (double)(iVar6 - *(int *)((long)*paiVar36 + lVar39)) * dVar50) / -10.0 +
                           -0.34242663);
              dVar51 = (dVar51 + 1.0) * (dVar48 + 1.0) * 3.8490018;
            }
            else {
              dVar51 = -dVar48;
            }
          }
        }
        dVar48 = exp((dVar51 * 10.0) / dVar4);
        *(double *)((long)*padVar16 + lVar39 * 2) = dVar48;
        iVar6 = *(int *)((long)*local_130 + lVar39);
        dVar48 = (double)iVar6 - (double)(iVar6 - *(int *)((long)*paiVar42 + lVar39)) * dVar50;
        if (iVar3 == 0) {
          dVar51 = 0.0;
          if ((int)dVar48 < 1) {
            dVar51 = -(double)(int)dVar48;
          }
        }
        else {
          dVar49 = dVar48 / -10.0;
          dVar51 = 0.0;
          if (-1.2283697 <= dVar49) {
            if (dVar49 <= 0.8660254) {
              dVar48 = sin(dVar49 + -0.34242663);
              iVar6 = *(int *)((long)*local_130 + lVar39);
              dVar51 = sin(((double)iVar6 -
                           (double)(iVar6 - *(int *)((long)*paiVar42 + lVar39)) * dVar50) / -10.0 +
                           -0.34242663);
              dVar51 = (dVar51 + 1.0) * (dVar48 + 1.0) * 3.8490018;
            }
            else {
              dVar51 = -dVar48;
            }
          }
        }
        dVar48 = exp((dVar51 * 10.0) / dVar4);
        uVar46 = SUB84(dVar48,0);
        uVar47 = (undefined4)((ulong)dVar48 >> 0x20);
      }
      *(ulong *)((long)padVar16[8] + lVar39 * 2) = CONCAT44(uVar47,uVar46);
    }
    padVar16 = padVar16 + 1;
    local_130 = local_130 + 1;
    paiVar42 = paiVar42 + 1;
    paiVar30 = paiVar30 + 1;
    paiVar36 = paiVar36 + 1;
  }
  padVar17 = pvVar7->expstack;
  paiVar40 = stackdH;
  paiVar43 = stack37;
  for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
    for (lVar39 = 0; lVar39 != 8; lVar39 = lVar39 + 1) {
      dVar48 = (double)(*paiVar40)[lVar39] -
               (double)((*paiVar40)[lVar39] - (*paiVar43)[lVar39]) * dVar50;
      if (iVar3 == 0) {
        dVar48 = (double)(int)dVar48;
      }
      dVar48 = exp((dVar48 * -10.0) / dVar4);
      (*padVar17)[lVar39] = dVar48;
    }
    padVar17 = padVar17 + 1;
    paiVar40 = paiVar40 + 1;
    paiVar43 = paiVar43 + 1;
  }
  paaiVar44 = mismatch1nIdH;
  paaiVar31 = mismatch1nI37;
  paaiVar18 = mismatchHdH;
  paaiVar10 = mismatchH37;
  paaiVar12 = mismatch23IdH;
  paaiVar13 = mismatch23I37;
  paaiVar24 = mismatchMdH;
  paaiVar25 = mismatchM37;
  paaiVar26 = mismatchExtdH;
  paaiVar27 = mismatchExt37;
  paaiVar28 = mismatchIdH;
  paaiVar29 = mismatchI37;
  local_a0 = pvVar7;
  for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
    lVar39 = 0;
    paiVar30 = *paaiVar18;
    paiVar36 = *paaiVar31;
    pvVar41 = local_a0;
    paiVar42 = *paaiVar44;
    local_130 = *paaiVar29;
    local_110 = *paaiVar28;
    local_f0 = *paaiVar26;
    local_e8 = *paaiVar13;
    local_e0 = *paaiVar27;
    local_d8 = *paaiVar12;
    local_c8 = (double (*) [8] [5] [5] [5] [5])paaiVar24;
    local_c0 = (double (*) [8] [5] [5] [5])paaiVar25;
    local_b0 = *paaiVar10;
    for (; lVar39 != 5; lVar39 = lVar39 + 1) {
      for (lVar37 = 0; lVar37 != 0x14; lVar37 = lVar37 + 4) {
        iVar6 = *(int *)((long)*(int (*) [5])*local_110 + lVar37);
        dVar48 = (double)iVar6 -
                 (double)(iVar6 - *(int *)((long)*(int (*) [5])*local_130 + lVar37)) * dVar50;
        if (iVar3 == 0) {
          dVar48 = (double)(int)dVar48;
        }
        dVar48 = exp((dVar48 * -10.0) / dVar4);
        *(double *)((long)pvVar41->expmismatchI[0][0] + lVar37 * 2) = dVar48;
        iVar6 = *(int *)((long)*(int (*) [5])*paiVar42 + lVar37);
        dVar48 = (double)iVar6 -
                 (double)(iVar6 - *(int *)((long)*(int (*) [5])*paiVar36 + lVar37)) * dVar50;
        if (iVar3 == 0) {
          dVar48 = (double)(int)dVar48;
        }
        dVar48 = exp((dVar48 * -10.0) / dVar4);
        *(double *)((long)pvVar41->expmismatch1nI[0][0] + lVar37 * 2) = dVar48;
        iVar6 = *(int *)((long)*(int (*) [5])*paiVar30 + lVar37);
        dVar48 = (double)iVar6 -
                 (double)(iVar6 - *(int *)((long)*(int (*) [5])*local_b0 + lVar37)) * dVar50;
        if (iVar3 == 0) {
          dVar48 = (double)(int)dVar48;
        }
        dVar48 = exp((dVar48 * -10.0) / dVar4);
        *(double *)((long)pvVar41->expmismatchH[0][0] + lVar37 * 2) = dVar48;
        iVar6 = *(int *)((long)*(int (*) [5])*local_d8 + lVar37);
        dVar48 = (double)iVar6 -
                 (double)(iVar6 - *(int *)((long)*(int (*) [5])*local_e8 + lVar37)) * dVar50;
        if (iVar3 == 0) {
          dVar48 = (double)(int)dVar48;
        }
        dVar48 = exp((dVar48 * -10.0) / dVar4);
        *(double *)((long)pvVar41->expmismatch23I[0][0] + lVar37 * 2) = dVar48;
        if (md->dangles == 0) {
          *(undefined8 *)((long)pvVar41->expmismatchExt[0][0] + lVar37 * 2) = 0x3ff0000000000000;
          lVar11 = 0x2430;
          uVar46 = 0;
          uVar47 = 0x3ff00000;
        }
        else {
          iVar6 = *(int *)((long)*(int (*) [5])*local_c8 + lVar37);
          dVar48 = (double)iVar6 -
                   (double)(iVar6 - *(int *)((long)*(int (*) [5])*local_c0 + lVar37)) * dVar50;
          if (iVar3 == 0) {
            dVar51 = 0.0;
            if ((int)dVar48 < 1) {
              dVar51 = -(double)(int)dVar48;
            }
          }
          else {
            dVar49 = dVar48 / -10.0;
            dVar51 = 0.0;
            if (-1.2283697 <= dVar49) {
              if (dVar49 <= 0.8660254) {
                dVar48 = sin(dVar49 + -0.34242663);
                iVar6 = *(int *)((long)*(int (*) [5])*local_c8 + lVar37);
                dVar51 = sin(((double)iVar6 -
                             (double)(iVar6 - *(int *)((long)*(int (*) [5])*local_c0 + lVar37)) *
                             dVar50) / -10.0 + -0.34242663);
                dVar51 = (dVar51 + 1.0) * (dVar48 + 1.0) * 3.8490018;
              }
              else {
                dVar51 = -dVar48;
              }
            }
          }
          dVar48 = exp((dVar51 * 10.0) / dVar4);
          *(double *)((long)pvVar41->expmismatchM[0][0] + lVar37 * 2) = dVar48;
          iVar6 = *(int *)((long)*(int (*) [5])*local_f0 + lVar37);
          dVar48 = (double)iVar6 -
                   (double)(iVar6 - *(int *)((long)*(int (*) [5])*local_e0 + lVar37)) * dVar50;
          if (iVar3 == 0) {
            dVar51 = 0.0;
            if ((int)dVar48 < 1) {
              dVar51 = -(double)(int)dVar48;
            }
          }
          else {
            dVar49 = dVar48 / -10.0;
            dVar51 = 0.0;
            if (-1.2283697 <= dVar49) {
              if (dVar49 <= 0.8660254) {
                dVar48 = sin(dVar49 + -0.34242663);
                iVar6 = *(int *)((long)*(int (*) [5])*local_f0 + lVar37);
                dVar51 = sin(((double)iVar6 -
                             (double)(iVar6 - *(int *)((long)*(int (*) [5])*local_e0 + lVar37)) *
                             dVar50) / -10.0 + -0.34242663);
                dVar51 = (dVar51 + 1.0) * (dVar48 + 1.0) * 3.8490018;
              }
              else {
                dVar51 = -dVar48;
              }
            }
          }
          dVar48 = exp((dVar51 * 10.0) / dVar4);
          uVar46 = SUB84(dVar48,0);
          uVar47 = (undefined4)((ulong)dVar48 >> 0x20);
          lVar11 = 0x4f0;
        }
        *(ulong *)((long)(pvVar41->expstack + -1) + 0x38 + lVar37 * 2 + lVar11) =
             CONCAT44(uVar47,uVar46);
      }
      pvVar41 = (vrna_exp_param_t *)(pvVar41->expstack[0] + 4);
      paiVar42 = paiVar42 + 1;
      paiVar36 = paiVar36 + 1;
      paiVar30 = paiVar30 + 1;
      local_b0 = local_b0 + 1;
      local_d8 = local_d8 + 1;
      local_e8 = local_e8 + 1;
      local_c8 = (double (*) [8] [5] [5] [5] [5])((long)local_c8 + 0x14);
      local_c0 = (double (*) [8] [5] [5] [5])((long)local_c0 + 0x14);
      local_f0 = local_f0 + 1;
      local_e0 = local_e0 + 1;
      local_110 = local_110 + 1;
      local_130 = local_130 + 1;
    }
    local_a0 = (vrna_exp_param_t *)(local_a0->expstack + 3);
    paaiVar44 = (int (*) [5] [5])((long)paaiVar44 + 100);
    paaiVar31 = (int (*) [5] [5])((long)paaiVar31 + 100);
    paaiVar18 = (int (*) [5] [5])((long)paaiVar18 + 100);
    paaiVar10 = (int (*) [5] [5])((long)paaiVar10 + 100);
    paaiVar12 = (int (*) [5] [5])((long)paaiVar12 + 100);
    paaiVar13 = (int (*) [5] [5])((long)paaiVar13 + 100);
    paaiVar24 = (int (*) [5] [5])((long)paaiVar24 + 100);
    paaiVar25 = (int (*) [5] [5])((long)paaiVar25 + 100);
    paaiVar26 = (int (*) [5] [5])((long)paaiVar26 + 100);
    paaiVar27 = (int (*) [5] [5])((long)paaiVar27 + 100);
    paaiVar28 = (int (*) [5] [5])((long)paaiVar28 + 100);
    paaiVar29 = (int (*) [5] [5])((long)paaiVar29 + 100);
  }
  local_b8 = pvVar7->expint11;
  local_e0 = (int (*) [5])int11_dH;
  local_f0 = (int (*) [5])int11_37;
  for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
    paaadVar19 = local_b8;
    paiVar30 = local_e0;
    paiVar36 = local_f0;
    for (lVar39 = 0; lVar39 != 8; lVar39 = lVar39 + 1) {
      paaadVar20 = paaadVar19;
      paiVar42 = paiVar30;
      paiVar45 = paiVar36;
      for (lVar37 = 0; lVar37 != 5; lVar37 = lVar37 + 1) {
        for (lVar11 = 0; lVar11 != 5; lVar11 = lVar11 + 1) {
          iVar6 = (*(int (*) [5] [5])*paiVar42)[0][lVar11];
          dVar48 = (double)iVar6 -
                   (double)(iVar6 - (*(int (*) [5] [5])*paiVar45)[0][lVar11]) * dVar50;
          if (iVar3 == 0) {
            dVar48 = (double)(int)dVar48;
          }
          dVar48 = exp((dVar48 * -10.0) / dVar4);
          (*paaadVar20)[0][0][lVar11] = dVar48;
        }
        paaadVar20 = (double (*) [8] [5] [5])((*paaadVar20)[0] + 1);
        paiVar42 = paiVar42 + 1;
        paiVar45 = paiVar45 + 1;
      }
      paaadVar19 = (double (*) [8] [5] [5])(*paaadVar19 + 1);
      paiVar30 = paiVar30 + 5;
      paiVar36 = paiVar36 + 5;
    }
    local_b8 = local_b8 + 1;
    local_e0 = local_e0 + 0x28;
    local_f0 = local_f0 + 0x28;
  }
  local_c8 = (double (*) [8] [5] [5] [5] [5])pvVar7->expint21;
  local_d0 = (int (*) [5])int21_dH;
  local_a8 = (int (*) [5])int21_37;
  for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
    local_e0 = local_a8;
    local_f0 = local_d0;
    local_c0 = (double (*) [8] [5] [5] [5])local_c8;
    for (lVar39 = 0; lVar39 != 8; lVar39 = lVar39 + 1) {
      paaaadVar21 = local_c0;
      paiVar30 = local_f0;
      paiVar36 = local_e0;
      for (lVar37 = 0; lVar37 != 5; lVar37 = lVar37 + 1) {
        paaaadVar22 = paaaadVar21;
        paiVar42 = paiVar30;
        paiVar45 = paiVar36;
        for (lVar11 = 0; lVar11 != 5; lVar11 = lVar11 + 1) {
          for (lVar38 = 0; lVar38 != 5; lVar38 = lVar38 + 1) {
            iVar6 = (*(int (*) [5] [5] [5])*paiVar42)[0][0][lVar38];
            dVar48 = (double)iVar6 -
                     (double)(iVar6 - (*(int (*) [5] [5] [5])*paiVar45)[0][0][lVar38]) * dVar50;
            if (iVar3 == 0) {
              dVar48 = (double)(int)dVar48;
            }
            dVar48 = exp((dVar48 * -10.0) / dVar4);
            (*paaaadVar22)[0][0][0][lVar38] = dVar48;
          }
          paaaadVar22 = (double (*) [8] [5] [5] [5])((*paaaadVar22)[0][0] + 1);
          paiVar42 = paiVar42 + 1;
          paiVar45 = paiVar45 + 1;
        }
        paaaadVar21 = (double (*) [8] [5] [5] [5])((*paaaadVar21)[0] + 1);
        paiVar30 = paiVar30 + 5;
        paiVar36 = paiVar36 + 5;
      }
      local_c0 = (double (*) [8] [5] [5] [5])(*local_c0 + 1);
      local_f0 = local_f0 + 0x19;
      local_e0 = local_e0 + 0x19;
    }
    local_c8 = (double (*) [8] [5] [5] [5] [5])((long)local_c8 + 8000);
    local_d0 = local_d0 + 200;
    local_a8 = local_a8 + 200;
  }
  local_88 = pvVar7->expint22;
  local_90 = (int (*) [5])int22_dH;
  local_98 = (int (*) [5])int22_37;
  for (lVar8 = 0; lVar8 != 8; lVar8 = lVar8 + 1) {
    local_d0 = local_98;
    local_a8 = local_90;
    local_a0 = (vrna_exp_param_t *)local_88;
    for (lVar39 = 0; lVar39 != 8; lVar39 = lVar39 + 1) {
      local_f0 = local_d0;
      local_c0 = (double (*) [8] [5] [5] [5])local_a8;
      local_c8 = (double (*) [8] [5] [5] [5] [5])local_a0;
      for (lVar37 = 0; lVar37 != 5; lVar37 = lVar37 + 1) {
        paaaaadVar32 = local_c8;
        paiVar30 = (int (*) [5])local_c0;
        paiVar36 = local_f0;
        for (lVar11 = 0; lVar11 != 5; lVar11 = lVar11 + 1) {
          paaaaadVar33 = paaaaadVar32;
          paiVar42 = paiVar30;
          paiVar45 = paiVar36;
          for (lVar38 = 0; lVar38 != 5; lVar38 = lVar38 + 1) {
            for (lVar23 = 0; lVar23 != 5; lVar23 = lVar23 + 1) {
              iVar6 = (*(int (*) [5] [5] [5] [5])*paiVar42)[0][0][0][lVar23];
              dVar48 = (double)iVar6 -
                       (double)(iVar6 - (*(int (*) [5] [5] [5] [5])*paiVar45)[0][0][0][lVar23]) *
                       dVar50;
              if (iVar3 == 0) {
                dVar48 = (double)(int)dVar48;
              }
              dVar48 = exp((dVar48 * -10.0) / dVar4);
              (*paaaaadVar33)[0][0][0][0][lVar23] = dVar48;
            }
            paaaaadVar33 = (double (*) [8] [5] [5] [5] [5])((*paaaaadVar33)[0][0][0] + 1);
            paiVar42 = paiVar42 + 1;
            paiVar45 = paiVar45 + 1;
          }
          paaaaadVar32 = (double (*) [8] [5] [5] [5] [5])((*paaaaadVar32)[0][0] + 1);
          paiVar30 = paiVar30 + 5;
          paiVar36 = paiVar36 + 5;
        }
        local_c8 = (double (*) [8] [5] [5] [5] [5])((*local_c8)[0] + 1);
        local_c0 = (double (*) [8] [5] [5] [5])((long)local_c0 + 500);
        local_f0 = local_f0 + 0x19;
      }
      local_a0 = (vrna_exp_param_t *)((double (*) [5] [5] [5] [5])&local_a0->id + 1);
      local_a8 = local_a8 + 0x7d;
      local_d0 = local_d0 + 0x7d;
    }
    local_88 = local_88 + 1;
    local_90 = local_90 + 1000;
    local_98 = local_98 + 1000;
  }
  strncpy(pvVar7->Tetraloops,Tetraloops,0x119);
  strncpy(pvVar7->Triloops,Triloops,0xf1);
  strncpy(pvVar7->Hexaloops,Hexaloops,0x169);
  return pvVar7;
}

Assistant:

PRIVATE vrna_exp_param_t *
get_exp_params_ali(vrna_md_t    *md,
                   unsigned int n_seq,
                   double       pfs)
{
  /* scale energy parameters and pre-calculate Boltzmann weights */
  unsigned int      i, j, k, l;
  int               pf_smooth;
  double            kTn, TT;
  double            GT;
  vrna_exp_param_t  *pf;

  pf                = (vrna_exp_param_t *)vrna_alloc(sizeof(vrna_exp_param_t));
  pf->model_details = *md;
  pf->alpha         = md->betaScale;
  pf->temperature   = md->temperature;
  pf->pf_scale      = pfs;
  pf->kT            = kTn = ((double)n_seq) * md->betaScale * (md->temperature + K0) * GASCONST; /* kT in cal/mol  */
  pf_smooth         = md->pf_smooth;
  TT                = (md->temperature + K0) / (Tmeasure);

  pf->lxc                   = lxc37 * TT;
  pf->expDuplexInit         = RESCALE_BF(DuplexInit37, DuplexInitdH, TT, kTn);
  pf->expTermAU             = RESCALE_BF(TerminalAU37, TerminalAUdH, TT, kTn);
  pf->expMLbase             = RESCALE_BF(ML_BASE37, ML_BASEdH, TT, kTn / n_seq);
  pf->expMLclosing          = RESCALE_BF(ML_closing37, ML_closingdH, TT, kTn);
  pf->expgquadLayerMismatch = RESCALE_BF(GQuadLayerMismatch37, GQuadLayerMismatchH, TT, kTn);
  pf->gquadLayerMismatchMax = GQuadLayerMismatchMax;

  for (i = VRNA_GQUAD_MIN_STACK_SIZE; i <= VRNA_GQUAD_MAX_STACK_SIZE; i++)
    for (j = 3 * VRNA_GQUAD_MIN_LINKER_LENGTH; j <= 3 * VRNA_GQUAD_MAX_LINKER_LENGTH; j++) {
      double  GQuadAlpha_T  = RESCALE_dG(GQuadAlpha37, GQuadAlphadH, TT);
      double  GQuadBeta_T   = RESCALE_dG(GQuadBeta37, GQuadBetadH, TT);
      GT = ((double)GQuadAlpha_T) * ((double)(i - 1)) + ((double)GQuadBeta_T) *
           log(((double)j) - 2.);
      pf->expgquad[i][j] = exp(-TRUNC_MAYBE(GT) * 10. / kTn);
    }

  /* loop energies: hairpins, bulges, interior, mulit-loops */
  for (i = 0; i < 31; i++)
    pf->exphairpin[i] = RESCALE_BF(hairpin37[i], hairpindH[i], TT, kTn);
  /*add penalty for too short hairpins*/
  for (i = 0; i < 3; i++) {
    GT                = 600 /*Penalty*/ * TT;
    pf->exphairpin[i] = exp(-GT * 10. / kTn);
  }

  for (i = 0; i <= MIN2(30, MAXLOOP); i++) {
    pf->expbulge[i]     = RESCALE_BF(bulge37[i], bulgedH[i], TT, kTn);
    pf->expinternal[i]  = RESCALE_BF(internal_loop37[i], internal_loopdH[i], TT, kTn);
  }

  /* special case of size 2 interior loops (single mismatch) */
  if (james_rule)
    pf->expinternal[2] = exp(-80 * 10. / kTn);

  GT = RESCALE_dG(bulge37[30], bulgedH[30], TT);
  for (i = 31; i <= MAXLOOP; i++)
    pf->expbulge[i] = exp(-(GT + (pf->lxc * log(i / 30.))) * 10. / kTn);

  GT = RESCALE_dG(internal_loop37[30], internal_loopdH[30], TT);
  for (i = 31; i <= MAXLOOP; i++)
    pf->expinternal[i] = exp(-(GT + (pf->lxc * log(i / 30.))) * 10. / kTn);

  GT = RESCALE_dG(ninio37, niniodH, TT);
  for (j = 0; j <= MAXLOOP; j++)
    pf->expninio[2][j] = exp(-MIN2(MAX_NINIO, j * GT) * 10. / kTn);

  for (i = 0; (i * 7) < strlen(Tetraloops); i++)
    pf->exptetra[i] = RESCALE_BF(Tetraloop37[i], TetraloopdH[i], TT, kTn);

  for (i = 0; (i * 5) < strlen(Triloops); i++)
    pf->exptri[i] = RESCALE_BF(Triloop37[i], TriloopdH[i], TT, kTn);

  for (i = 0; (i * 9) < strlen(Hexaloops); i++)
    pf->exphex[i] = RESCALE_BF(Hexaloop37[i], HexaloopdH[i], TT, kTn);

  for (i = 0; i <= NBPAIRS; i++)
    /* includes AU penalty */
    pf->expMLintern[i] = RESCALE_BF(ML_intern37, ML_interndH, TT, kTn);

  /* if dangle_model==0 just set their energy to 0,
   * don't let dangle energies become > 0 (at large temps),
   * but make sure go smoothly to 0                        */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= 4; j++) {
      if (md->dangles) {
        pf->expdangle5[i][j] = RESCALE_BF_SMOOTH(dangle5_37[i][j],
                                                 dangle5_dH[i][j],
                                                 TT,
                                                 kTn);
        pf->expdangle3[i][j] = RESCALE_BF_SMOOTH(dangle3_37[i][j],
                                                 dangle3_dH[i][j],
                                                 TT,
                                                 kTn);
      } else {
        pf->expdangle3[i][j] = pf->expdangle5[i][j] = 1;
      }
    }

  /* stacking energies */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++) {
      pf->expstack[i][j] = RESCALE_BF(stack37[i][j],
                                      stackdH[i][j],
                                      TT,
                                      kTn);
    }

  /* mismatch energies */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j < 5; j++)
      for (k = 0; k < 5; k++) {
        pf->expmismatchI[i][j][k] = RESCALE_BF(mismatchI37[i][j][k],
                                               mismatchIdH[i][j][k],
                                               TT,
                                               kTn);
        pf->expmismatch1nI[i][j][k] = RESCALE_BF(mismatch1nI37[i][j][k],
                                                 mismatch1nIdH[i][j][k],
                                                 TT,
                                                 kTn);
        pf->expmismatchH[i][j][k] = RESCALE_BF(mismatchH37[i][j][k],
                                               mismatchHdH[i][j][k],
                                               TT,
                                               kTn);
        pf->expmismatch23I[i][j][k] = RESCALE_BF(mismatch23I37[i][j][k],
                                                 mismatch23IdH[i][j][k],
                                                 TT,
                                                 kTn);

        if (md->dangles) {
          pf->expmismatchM[i][j][k] = RESCALE_BF_SMOOTH(mismatchM37[i][j][k],
                                                        mismatchMdH[i][j][k],
                                                        TT,
                                                        kTn);
          pf->expmismatchExt[i][j][k] = RESCALE_BF_SMOOTH(mismatchExt37[i][j][k],
                                                          mismatchExtdH[i][j][k],
                                                          TT,
                                                          kTn);
        } else {
          pf->expmismatchM[i][j][k] = pf->expmismatchExt[i][j][k] = 1.;
        }
      }

  /* interior lops of length 2 */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          pf->expint11[i][j][k][l] = RESCALE_BF(int11_37[i][j][k][l],
                                                int11_dH[i][j][k][l],
                                                TT,
                                                kTn);
        }

  /* interior 2x1 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          int m;
          for (m = 0; m < 5; m++) {
            pf->expint21[i][j][k][l][m] = RESCALE_BF(int21_37[i][j][k][l][m],
                                                     int21_dH[i][j][k][l][m],
                                                     TT,
                                                     kTn);
          }
        }

  /* interior 2x2 loops */
  for (i = 0; i <= NBPAIRS; i++)
    for (j = 0; j <= NBPAIRS; j++)
      for (k = 0; k < 5; k++)
        for (l = 0; l < 5; l++) {
          int m, n;
          for (m = 0; m < 5; m++)
            for (n = 0; n < 5; n++) {
              pf->expint22[i][j][k][l][m][n] = RESCALE_BF(int22_37[i][j][k][l][m][n],
                                                          int22_dH[i][j][k][l][m][n],
                                                          TT,
                                                          kTn);
            }
        }

  strncpy(pf->Tetraloops, Tetraloops, 281);
  strncpy(pf->Triloops, Triloops, 241);
  strncpy(pf->Hexaloops, Hexaloops, 361);

  return pf;
}